

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::decodeArray
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,size_t param_2,
          uint32_t *out,size_t *nvalue)

{
  int iVar1;
  undefined4 extraout_var;
  NotEnoughStorage *this_00;
  ulong uVar3;
  uint32_t uVar4;
  size_t out_len;
  long local_40;
  uint32_t *local_38;
  uint32_t *puVar2;
  
  uVar4 = *in;
  if (*nvalue < (ulong)(uVar4 << 7)) {
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(this_00,(ulong)*in);
    __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = in + 1;
  local_40 = 0;
  local_38 = out;
  if (uVar4 != 0) {
    do {
      iVar1 = (*(this->super_IntegerCODEC)._vptr_IntegerCODEC[0xb])(this,puVar2,out,&local_40);
      puVar2 = (uint32_t *)CONCAT44(extraout_var,iVar1);
      out = out + local_40;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  uVar3 = (long)out - (long)local_38 >> 2;
  if (*nvalue < uVar3) {
    NewPFor<4u,FastPForLib::Simple16<false>>::decodeArray();
  }
  *nvalue = uVar3;
  return puVar2;
}

Assistant:

const uint32_t *
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeArray(
#ifndef NDEBUG
    const uint32_t *in, const size_t len, uint32_t *out, size_t &nvalue) {
#else
    const uint32_t *in, const size_t, uint32_t *out, size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  const uint32_t *const initout(out);

  if (BlockSize * (*in) > nvalue)
    throw NotEnoughStorage(*in);
  const uint32_t numBlocks = *in++;
  size_t out_len = 0;
  for (uint32_t i = 0; i < numBlocks; i++) {
    in = decodeBlock(in, out, out_len);
    out += out_len;
  }

  if (static_cast<size_t>(out - initout) > nvalue) {
    fprintf(stderr, "possible buffer overrun\n");
  }
  ASSERT(in <= len + initin,
      std::to_string(in - initin) + " " + std::to_string(len));

  nvalue = out - initout;
  assert(nvalue == numBlocks * BlockSize);
  return in;
}